

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

void __thiscall
llvm::detail::DoubleAPFloat::DoubleAPFloat
          (DoubleAPFloat *this,fltSemantics *S,uninitializedTag param_2)

{
  undefined8 *puVar1;
  
  this->Semantics = S;
  puVar1 = (undefined8 *)operator_new__(0x48);
  *puVar1 = 2;
  IEEEFloat::IEEEFloat((IEEEFloat *)(puVar1 + 2),(fltSemantics *)semIEEEdouble,uninitialized);
  IEEEFloat::IEEEFloat((IEEEFloat *)(puVar1 + 6),(fltSemantics *)semIEEEdouble,uninitialized);
  (this->Floats)._M_t.super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
  _M_t.super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
  super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl = (APFloat *)(puVar1 + 1);
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    return;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0xf13,
                "llvm::detail::DoubleAPFloat::DoubleAPFloat(const fltSemantics &, uninitializedTag)"
               );
}

Assistant:

DoubleAPFloat::DoubleAPFloat(const fltSemantics &S, uninitializedTag)
    : Semantics(&S),
      Floats(new APFloat[2]{APFloat(semIEEEdouble, uninitialized),
                            APFloat(semIEEEdouble, uninitialized)}) {
  assert(Semantics == &semPPCDoubleDouble);
}